

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_table_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_table_verifier_f *tvf)

{
  int iVar1;
  uint uVar2;
  flatbuffers_uoffset_t base;
  uint local_3c;
  flatcc_table_verifier_descriptor_t local_38;
  ulong uVar3;
  
  iVar1 = get_offset_field(td,id,required,&local_3c);
  if (local_3c != 0 && iVar1 == 0) {
    local_38.buf = td->buf;
    local_38.end = td->end;
    local_38.ttl = td->ttl + -1;
    if (local_38.ttl == 0) {
      iVar1 = 3;
    }
    else {
      local_38.table = *(int *)((long)local_38.buf + (ulong)local_3c) + local_3c;
      iVar1 = 0xf;
      if ((local_3c < local_38.table) &&
         ((local_38.table & 3) == 0 && (ulong)local_38.table + 4 <= (ulong)local_38.end)) {
        uVar2 = local_38.table - *(int *)((long)local_38.buf + (ulong)local_38.table);
        uVar3 = (ulong)uVar2;
        iVar1 = 0x1d;
        if ((uVar2 & 1) == 0 && -1 < (int)uVar2) {
          iVar1 = 0x1b;
          if (uVar3 + 2 <= (ulong)local_38.end) {
            local_38.vsize = *(ushort *)((long)local_38.buf + uVar3);
            iVar1 = 0x1e;
            if (((local_38.vsize & 1) == 0 && uVar2 + local_38.vsize <= local_38.end) &&
               (iVar1 = 0x1c, 3 < local_38.vsize)) {
              local_38.tsize = *(ushort *)((long)local_38.buf + uVar3 + 2);
              iVar1 = 0x14;
              if ((uint)local_38.tsize <= local_38.end - local_38.table) {
                local_38.vtable = (void *)(uVar3 + (long)local_38.buf);
                iVar1 = (*tvf)(&local_38);
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_table_field(flatcc_table_verifier_descriptor_t *td,
    voffset_t id, int required, flatcc_table_verifier_f tvf)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_table(td->buf, td->end, base, read_uoffset(td->buf, base), td->ttl, tvf);
}